

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

CTypeID lj_ccall_ctid_vararg(CTState *cts,cTValue *o)

{
  ushort uVar1;
  uint *puVar2;
  uint *in_RSI;
  long *in_RDI;
  CType *s;
  CTypeID id;
  CTInfo info;
  undefined4 in_stack_ffffffffffffffc8;
  uint local_20;
  
  if (in_RSI[1] < 0xffff0000) {
    local_20 = 0xe;
  }
  else if (in_RSI[1] == 0xfffffff5) {
    uVar1 = *(ushort *)((ulong)*in_RSI + 6);
    local_20 = (uint)uVar1;
    puVar2 = (uint *)(*in_RDI + (ulong)local_20 * 0x10);
    info = (CTInfo)((ulong)puVar2 >> 0x20);
    if ((*puVar2 & 0xfc000000) == 0x30000000) {
      local_20 = lj_ctype_intern((CTState *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffc8),info,
                                 (CTSize)puVar2);
    }
    else if ((*puVar2 >> 0x1c == 1) || (*puVar2 >> 0x1c == 6)) {
      local_20 = lj_ctype_intern((CTState *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffc8),info,
                                 (CTSize)puVar2);
    }
    else if (((*puVar2 & 0xf4000000) == 0x4000000) && (puVar2[1] == 4)) {
      local_20 = 0xe;
    }
  }
  else if (in_RSI[1] == 0xfffffffb) {
    local_20 = 0x13;
  }
  else if ((in_RSI[1] == 0xfffffffe) || (in_RSI[1] == 0xfffffffd)) {
    local_20 = 3;
  }
  else {
    local_20 = 0x11;
  }
  return local_20;
}

Assistant:

CTypeID lj_ccall_ctid_vararg(CTState *cts, cTValue *o)
{
  if (tvisnumber(o)) {
    return CTID_DOUBLE;
  } else if (tviscdata(o)) {
    CTypeID id = cdataV(o)->ctypeid;
    CType *s = ctype_get(cts, id);
    if (ctype_isrefarray(s->info)) {
      return lj_ctype_intern(cts,
	       CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(s->info)), CTSIZE_PTR);
    } else if (ctype_isstruct(s->info) || ctype_isfunc(s->info)) {
      /* NYI: how to pass a struct by value in a vararg argument? */
      return lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR);
    } else if (ctype_isfp(s->info) && s->size == sizeof(float)) {
      return CTID_DOUBLE;
    } else {
      return id;
    }
  } else if (tvisstr(o)) {
    return CTID_P_CCHAR;
  } else if (tvisbool(o)) {
    return CTID_BOOL;
  } else {
    return CTID_P_VOID;
  }
}